

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O3

ptr<FakeClient> __thiscall nuraft::FakeNetwork::findClient(FakeNetwork *this,string *endpoint)

{
  _Base_ptr p_Var1;
  int iVar2;
  iterator iVar3;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<FakeClient> pVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&endpoint[4].field_2);
  if (iVar2 == 0) {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
                    *)(endpoint + 3),in_RDX);
    if (iVar3._M_node == (_Base_ptr)&endpoint[3]._M_string_length) {
      (this->super_rpc_client_factory)._vptr_rpc_client_factory = (_func_int **)0x0;
      (this->super_rpc_listener)._vptr_rpc_listener = (_func_int **)0x0;
    }
    else {
      (this->super_rpc_client_factory)._vptr_rpc_client_factory =
           *(_func_int ***)(iVar3._M_node + 2);
      p_Var1 = iVar3._M_node[2]._M_parent;
      (this->super_rpc_listener)._vptr_rpc_listener = (_func_int **)p_Var1;
      if (p_Var1 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&endpoint[4].field_2);
    pVar4.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    pVar4.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (ptr<FakeClient>)pVar4.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

ptr<FakeClient> FakeNetwork::findClient(const std::string& endpoint) {
    std::lock_guard<std::mutex> ll(clientsLock);
    auto entry = clients.find(endpoint);
    if (entry == clients.end()) return nullptr;
    return entry->second;
}